

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::MakeIfdefGuardIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view header_path)

{
  string_view s;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  string local_108 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  string_view local_88;
  AlphaNum local_58;
  
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_e8,(char (*) [2])0x365c68,(char (*) [2])0x3f33d2);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_c8,(char (*) [2])0x41082e,(char (*) [2])0x3f33d2);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_a8,(char (*) [2])0x2afaf3,(char (*) [2])0x3f33d2);
  absl::lts_20240722::StrReplaceAll_abi_cxx11_(local_108,this,header_path._M_len,&local_e8,3);
  s._M_str = in_stack_fffffffffffffee0;
  s._M_len = in_stack_fffffffffffffed8;
  absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(s);
  local_88 = absl::lts_20240722::NullSafeStringView("_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  std::__cxx11::string::~string(local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string MakeIfdefGuardIdentifier(const absl::string_view header_path) {
  return absl::StrCat(absl::AsciiStrToUpper(absl::StrReplaceAll(header_path,
                                                                {
                                                                    {"/", "_"},
                                                                    {".", "_"},
                                                                    {"-", "_"},
                                                                })),
                      "_");
}